

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                     *that,allocator_type *a)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  anon_union_8_1_a8a14541_for_iterator_1 args;
  size_t hashval;
  FindInfo FVar3;
  const_iterator __begin0;
  HashElement local_48;
  iterator local_40;
  
  this->ctrl_ = EmptyGroup()::empty_group;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_0UL,_false>
  .value = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  rehash(this,that->capacity_);
  local_40 = begin(that);
  pcVar1 = that->ctrl_;
  sVar2 = that->capacity_;
  while (local_40.ctrl_ != pcVar1 + sVar2) {
    args = local_40.field_1;
    local_48.h = (hasher *)&this->settings_;
    hashval = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>::HashElement,std::pair<cs_impl::any_const,cs_impl::any>const&>
                        (&local_48,(pair<const_cs_impl::any,_cs_impl::any> *)local_40.field_1.slot_)
    ;
    FVar3 = find_first_non_full(this,hashval);
    set_ctrl(this,FVar3.offset,(byte)hashval & 0x7f);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
    ::emplace_at<std::pair<cs_impl::any_const,cs_impl::any>const&>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                *)this,FVar3.offset,(pair<const_cs_impl::any,_cs_impl::any> *)args.slot_);
    iterator::operator++(&local_40);
  }
  sVar2 = that->size_;
  this->size_ = sVar2;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_0UL,_false>
  .value = (this->settings_).
           super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>,_0UL,_false>
           .value - sVar2;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
				: raw_hash_set(0, that.hash_ref(), that.eq_ref(), a)
			{
				rehash(that.capacity());   // operator=() should preserve load_factor
				// Because the table is guaranteed to be empty, we can do something faster
				// than a full `insert`.
				for (const auto& v : that) {
					const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
					auto target = find_first_non_full(hashval);
					set_ctrl(target.offset, H2(hashval));
					emplace_at(target.offset, v);
					infoz_.RecordInsert(hashval, target.probe_length);
				}
				size_ = that.size();
				growth_left() -= that.size();
			}